

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  istream *piVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  char cVar17;
  bool bVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  double float_val;
  ulong local_60;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar2 = std::istream::peek();
      iVar2 = isspace(iVar2);
      if (iVar2 == 0) break;
      std::istream::get();
    }
  }
  iVar2 = std::istream::peek();
  if ((iVar2 != 0x2d) && (iVar2 != 0x30)) {
    std::istream::_M_extract<double>((double *)is);
    (value->value_).data_ = 0;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      (value->value_).data_ = 0;
    }
    return is;
  }
  iVar3 = iVar2;
  if (iVar2 == 0x2d) {
    std::istream::get();
    iVar3 = std::istream::peek();
  }
  if (iVar3 == 0x30) {
    std::istream::get();
    uVar4 = std::istream::peek();
    if ((uVar4 & 0xffffffdf) == 0x58) {
      std::istream::get();
      uVar6 = std::istream::peek();
      iVar3 = (int)uVar6;
      while (iVar3 == 0x30) {
        std::istream::get();
        uVar6 = std::istream::peek();
        iVar3 = (int)uVar6;
      }
      uVar6 = uVar6 & 0xffffffff;
      lVar19 = 0x3ff;
      bVar21 = false;
      local_60 = 0;
      bVar1 = 0;
      bVar13 = false;
      uVar12 = 0;
      do {
        iVar3 = (int)uVar6;
        if (iVar3 == 0x2e) {
          bVar18 = true;
        }
        else if (iVar3 == 0x70) {
          bVar21 = true;
          bVar18 = false;
        }
        else {
          iVar5 = isxdigit(iVar3);
          if (iVar5 == 0) goto LAB_001aea30;
          pvVar8 = memchr("0123456789",iVar3,0xb);
          if (pvVar8 == (void *)0x0) {
            cVar17 = '\x03';
            pvVar8 = memchr("abcdef",iVar3,7);
            if (pvVar8 == (void *)0x0) {
              cVar17 = '\n';
              pvVar8 = memchr("ABCDEF",iVar3,7);
              if (pvVar8 == (void *)0x0) goto LAB_001aebb3;
            }
            bVar1 = ((char)pvVar8 - cVar17) + 10;
          }
          else {
            bVar1 = (char)pvVar8 + 0xa3;
          }
          uVar4 = (uint)bVar1;
          iVar3 = 4;
          uVar6 = uVar12;
          do {
            uVar14 = uVar4 & 8;
            uVar12 = uVar6;
            if (bVar13) {
              if (lVar19 == 0x7fffffffffffffff) goto LAB_001aea30;
              uVar12 = uVar6 + 1;
              if (uVar12 == 0) {
                uVar12 = 0xffffffffffffffff;
              }
              uVar9 = (ulong)(uVar14 >> 3) << (~(byte)uVar6 & 0x3f);
              if (uVar14 == 0) {
                uVar9 = 0;
              }
              if (0x3f < uVar6) {
                uVar9 = 0;
              }
              local_60 = local_60 | uVar9;
              lVar19 = lVar19 + 1;
            }
            bVar13 = (bool)(bVar13 | uVar14 != 0);
            uVar4 = uVar4 * 2;
            iVar3 = iVar3 + -1;
            uVar6 = uVar12;
          } while (iVar3 != 0);
          bVar18 = false;
          bVar1 = 1;
        }
        std::istream::get();
        uVar6 = std::istream::peek();
        uVar6 = uVar6 & 0xffffffff;
      } while ((!bVar18) && (!bVar21));
      if (bVar18 == true && !bVar21) {
        uVar4 = 0;
        do {
          iVar3 = (int)uVar6;
          bVar13 = true;
          if (iVar3 != 0x70) {
            iVar5 = isxdigit(iVar3);
            if (iVar5 == 0) goto LAB_001aea30;
            pvVar8 = memchr("0123456789",iVar3,0xb);
            if (pvVar8 == (void *)0x0) {
              cVar17 = '\x03';
              pvVar8 = memchr("abcdef",iVar3,7);
              if (pvVar8 == (void *)0x0) {
                cVar17 = '\n';
                pvVar8 = memchr("ABCDEF",iVar3,7);
                if (pvVar8 == (void *)0x0) {
LAB_001aebb3:
                  __assert_fail("false && \"This was called with a non-hex character\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/util/hex_float.h"
                                ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
                }
              }
              bVar11 = ((char)pvVar8 - cVar17) + 10;
            }
            else {
              bVar11 = (char)pvVar8 + 0xa3;
            }
            uVar14 = (uint)bVar11;
            iVar3 = 4;
            do {
              uVar15 = uVar14 >> 3 & 1;
              uVar4 = uVar4 | uVar15;
              if ((bVar1 == 0) && (uVar4 == 0)) {
                if (lVar19 == -0x8000000000000000) goto LAB_001aea30;
                lVar19 = lVar19 + -1;
              }
              else {
                uVar6 = (ulong)uVar15 << (~(byte)uVar12 & 0x3f);
                if (uVar15 == 0) {
                  uVar6 = 0;
                }
                if (0x3f < uVar12) {
                  uVar6 = 0;
                }
                local_60 = local_60 | uVar6;
                uVar12 = uVar12 + 1;
                if (uVar12 == 0) {
                  uVar12 = 0xffffffffffffffff;
                }
              }
              uVar14 = uVar14 * 2;
              iVar3 = iVar3 + -1;
              bVar13 = bVar21;
            } while (iVar3 != 0);
          }
          bVar21 = bVar13;
          std::istream::get();
          uVar6 = std::istream::peek();
          uVar6 = uVar6 & 0xffffffff;
        } while (!bVar21);
      }
      bVar11 = 1;
      bVar13 = false;
      bVar21 = false;
      lVar16 = 0;
      do {
        iVar3 = (int)uVar6;
        if (bVar21) {
          if (9 < iVar3 - 0x30U) {
            lVar16 = lVar16 * (char)bVar11;
            if ((lVar16 < 0) || (lVar19 < 0)) {
              if ((lVar16 < 0) && (lVar19 < 0)) {
                lVar20 = lVar19 + 0x7ffffffffffffffe;
                uVar6 = lVar16 + lVar19;
                if (lVar20 == -lVar16 || SBORROW8(lVar20,-lVar16) != lVar20 + lVar16 < 0) {
                  uVar6 = 0x8000000000000002;
                }
              }
              else {
                uVar6 = lVar16 + lVar19;
              }
            }
            else {
              uVar6 = lVar19 + lVar16;
              if (0x7ffffffffffffffe - lVar19 <= lVar16) {
                uVar6 = 0x7ffffffffffffffe;
              }
            }
            bVar21 = local_60 == 0;
            local_60 = local_60 << ~(bVar1 | bVar21);
            bVar13 = (bool)(~bVar1 & bVar21);
            uVar12 = 0;
            if (!bVar13) {
              uVar12 = uVar6;
            }
            uVar9 = (local_60 >> 1) + 0x8000000000000000;
            if (bVar13) {
              uVar9 = local_60;
            }
            if (bVar1 == 0 && !bVar21) {
              uVar12 = uVar6 - 1;
            }
            if (0 < (long)uVar12) {
              uVar9 = local_60;
            }
            uVar9 = uVar9 >> 0xc;
            if (((long)uVar12 < 0) && (!bVar13)) {
              uVar10 = uVar9;
              uVar6 = uVar12;
              do {
                uVar6 = uVar6 + 1;
                uVar9 = uVar10 >> 1;
                uVar12 = uVar6;
                if (uVar10 < 2) {
                  uVar12 = 0;
                }
              } while (((long)uVar12 < 0) && (bVar13 = 1 < uVar10, uVar10 = uVar9, bVar13));
            }
            uVar6 = 0x7ff;
            if ((long)uVar12 < 0x7ff) {
              uVar6 = uVar12;
            }
            if (0x7ff < (long)uVar12) {
              uVar9 = 0;
            }
            uVar12 = 0x8000000000000000;
            if (iVar2 != 0x2d) {
              uVar12 = 0;
            }
            (value->value_).data_ = (uVar6 & 0x7ff) << 0x34 | uVar12 | uVar9;
            return is;
          }
LAB_001ae7c6:
          lVar20 = (uVar6 - 0x30) + lVar16 * 10;
          if ((long)((0x800000000000002e - uVar6) / 10) <= lVar16) {
            lVar20 = 0x7ffffffffffffffe;
          }
          bVar21 = true;
          lVar16 = lVar20;
        }
        else {
          if ((iVar3 != 0x2d) && (iVar3 != 0x2b)) {
            if (iVar3 - 0x30U < 10) goto LAB_001ae7c6;
LAB_001aea30:
            std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
            return is;
          }
          if (bVar13) goto LAB_001aea30;
          bVar11 = -(iVar3 == 0x2d) | 1;
          bVar13 = true;
          bVar21 = false;
        }
        std::istream::get();
        uVar6 = std::istream::peek();
        uVar6 = uVar6 & 0xffffffff;
      } while( true );
    }
    std::istream::unget();
  }
  piVar7 = ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                     (is,iVar2 == 0x2d,value);
  return piVar7;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}